

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.hpp
# Opt level: O1

type unodb::qsbr_state::dec_thread_count(type word)

{
  bool bVar1;
  type tVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  qsbr_epoch local_31;
  
  uVar5 = (uint)((word & 0x3fffffff3fffffff) >> 0x20);
  uVar6 = (uint)(word & 0x3fffffff3fffffff);
  if (uVar6 <= uVar5) {
    if (uVar5 == 0) {
      __assert_fail("get_thread_count(word) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                    ,0x123,"static type unodb::qsbr_state::dec_thread_count(type)");
    }
    tVar2 = word - 0x100000000;
    uVar3 = (uint)(tVar2 >> 0x20) & 0x3fffffff;
    uVar4 = (uint)word & 0x3fffffff;
    if (uVar4 <= uVar3) {
      bVar1 = detail::qsbr_epoch::operator==(&local_31,(qsbr_epoch)(epoch_type)(tVar2 >> 0x3e));
      if (!bVar1) {
        __assert_fail("get_epoch(word) == get_epoch(result)",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                      ,0x128,"static type unodb::qsbr_state::dec_thread_count(type)");
      }
      if (uVar6 == uVar4) {
        if (uVar5 - 1 == uVar3) {
          return tVar2;
        }
        __assert_fail("get_thread_count(word) - 1 == get_thread_count(result)",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                      ,299,"static type unodb::qsbr_state::dec_thread_count(type)");
      }
      __assert_fail("get_threads_in_previous_epoch(word) == get_threads_in_previous_epoch(result)",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                    ,0x12a,"static type unodb::qsbr_state::dec_thread_count(type)");
    }
  }
  __assert_fail("threads_in_previous <= thread_count",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                ,0x19b,"static void unodb::qsbr_state::assert_invariants(type)");
}

Assistant:

[[nodiscard, gnu::const]] static constexpr type dec_thread_count(
      type word) noexcept {
    assert_invariants(word);
    UNODB_DETAIL_ASSERT(get_thread_count(word) > 0);

    const auto result = word - one_thread_in_count;

    assert_invariants(result);
    UNODB_DETAIL_ASSERT(get_epoch(word) == get_epoch(result));
    UNODB_DETAIL_ASSERT(get_threads_in_previous_epoch(word) ==
                        get_threads_in_previous_epoch(result));
    UNODB_DETAIL_ASSERT(get_thread_count(word) - 1 == get_thread_count(result));

    return result;
  }